

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v8::detail::format_uint<1u,char,unsigned_int>
                 (char *buffer,uint value,int num_digits,bool upper)

{
  uint digit;
  char *digits;
  char *end;
  uint uStack_14;
  bool upper_local;
  int num_digits_local;
  uint value_local;
  char *buffer_local;
  
  uStack_14 = value;
  _num_digits_local = buffer + num_digits;
  do {
    _num_digits_local[-1] = ((byte)uStack_14 & 1) + 0x30;
    uStack_14 = uStack_14 >> 1;
    _num_digits_local = _num_digits_local + -1;
  } while (uStack_14 != 0);
  return buffer + num_digits;
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}